

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
::occluded(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
           *this,vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  vint<4> *pvVar6;
  int iVar7;
  uint uVar8;
  NodeRef nodeRef;
  undefined1 *puVar9;
  vint<4> *pvVar10;
  ulong uVar11;
  ulong uVar12;
  code *pcVar13;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar14;
  uint i;
  long lVar15;
  vint<4> *pvVar16;
  NodeRef *pNVar17;
  ulong uVar18;
  bool bVar19;
  int iVar20;
  float fVar29;
  float fVar30;
  vint4 bi;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar31 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar38;
  float fVar39;
  vint4 bi_1;
  undefined1 auVar36 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar37;
  float fVar40;
  float fVar43;
  float fVar44;
  vint4 ai;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar45;
  float fVar46;
  float fVar48;
  float fVar49;
  vint4 ai_1;
  undefined1 auVar47 [16];
  float fVar50;
  float fVar51;
  float fVar53;
  float fVar54;
  vint4 ai_3;
  undefined1 auVar52 [16];
  float fVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  vint4 bi_2;
  uint uVar61;
  uint uVar62;
  float fVar63;
  float fVar65;
  float fVar66;
  vint4 bi_3;
  undefined1 auVar64 [16];
  float fVar67;
  uint uVar68;
  float fVar69;
  uint uVar70;
  float fVar71;
  uint uVar72;
  vint4 ai_2;
  float fVar73;
  uint uVar74;
  undefined1 auVar75 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  int iVar88;
  int iVar89;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar90;
  vint4 bi_8;
  vint<4> *local_17e0;
  undefined8 local_17d8;
  undefined4 local_17d0;
  vint<4> *local_17c8;
  Intersectors *local_17c0;
  undefined4 local_17b8;
  uint local_17b4;
  long local_17b0;
  undefined8 local_17a8;
  long local_17a0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1798;
  float local_1788;
  float fStack_1784;
  float fStack_1780;
  float fStack_177c;
  float local_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  uint local_1738;
  uint uStack_1734;
  uint uStack_1730;
  uint uStack_172c;
  undefined1 local_1728 [16];
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  lVar15 = (valid_i->field_0).v[0];
  pvVar16 = *(vint<4> **)(lVar15 + 0x70);
  if (pvVar16 != (vint<4> *)0x8) {
    if ((*(long *)(ray + 8) != 0) &&
       (lVar15 = *(long *)(ray + 0x10), (*(byte *)(lVar15 + 2) & 1) != 0)) {
      occludedCoherent(this,valid_i,This,ray,context);
      return;
    }
    auVar24._8_4_ = 0xffffffff;
    auVar24._0_8_ = 0xffffffffffffffff;
    auVar24._12_4_ = 0xffffffff;
    auVar34 = *(undefined1 (*) [16])&(This->intersector4_nofilter).name;
    auVar75._0_8_ =
         CONCAT44(-(uint)(*(int *)(this + 4) == -1 && 0.0 <= auVar34._4_4_),
                  -(uint)(*(int *)this == -1 && 0.0 <= auVar34._0_4_));
    auVar75._8_4_ = -(uint)(*(int *)(this + 8) == -1 && 0.0 <= auVar34._8_4_);
    auVar75._12_4_ = -(uint)(*(int *)(this + 0xc) == -1 && 0.0 <= auVar34._12_4_);
    iVar7 = movmskps((int)lVar15,auVar75);
    if (iVar7 != 0) {
      fVar76 = *(float *)&This->ptr;
      fVar77 = *(float *)((long)&This->ptr + 4);
      fVar78 = *(float *)&This->leafIntersector;
      fVar79 = *(float *)((long)&This->leafIntersector + 4);
      fVar80 = *(float *)&(This->collider).collide;
      fVar81 = *(float *)((long)&(This->collider).collide + 4);
      fVar82 = *(float *)&(This->collider).name;
      fVar83 = *(float *)((long)&(This->collider).name + 4);
      fVar84 = *(float *)&(This->intersector1).intersect;
      fVar85 = *(float *)((long)&(This->intersector1).intersect + 4);
      fVar86 = *(float *)&(This->intersector1).occluded;
      fVar87 = *(float *)((long)&(This->intersector1).occluded + 4);
      auVar64._0_8_ = (This->intersector1).pointQuery;
      auVar64._8_8_ = (This->intersector1).name;
      auVar47._0_8_ = (This->intersector4).intersect;
      auVar47._8_8_ = (This->intersector4).occluded;
      fVar67 = (float)DAT_01f80d30;
      fVar69 = DAT_01f80d30._4_4_;
      fVar71 = DAT_01f80d30._8_4_;
      fVar73 = DAT_01f80d30._12_4_;
      auVar41._4_4_ = -(uint)(ABS((float)((ulong)auVar47._0_8_ >> 0x20)) < fVar69);
      auVar41._0_4_ = -(uint)(ABS((float)auVar47._0_8_) < fVar67);
      auVar41._8_4_ = -(uint)(ABS((float)auVar47._8_8_) < fVar71);
      auVar41._12_4_ = -(uint)(ABS((float)((ulong)auVar47._8_8_ >> 0x20)) < fVar73);
      auVar41 = blendvps(auVar47,_DAT_01f80d30,auVar41);
      auVar47 = *(undefined1 (*) [16])&(This->intersector4).name;
      auVar21._4_4_ = -(uint)(ABS(auVar47._4_4_) < fVar69);
      auVar21._0_4_ = -(uint)(ABS(auVar47._0_4_) < fVar67);
      auVar21._8_4_ = -(uint)(ABS(auVar47._8_4_) < fVar71);
      auVar21._12_4_ = -(uint)(ABS(auVar47._12_4_) < fVar73);
      auVar47 = blendvps(auVar47,_DAT_01f80d30,auVar21);
      auVar52._0_8_ = (This->intersector4_filter).occluded;
      auVar52._8_8_ = (This->intersector4_filter).name;
      iVar7 = -(uint)(ABS((float)auVar52._8_8_) < fVar71);
      iVar20 = -(uint)(ABS((float)((ulong)auVar52._8_8_ >> 0x20)) < fVar73);
      auVar31._0_8_ =
           CONCAT44(-(uint)(ABS((float)((ulong)auVar52._0_8_ >> 0x20)) < fVar69),
                    -(uint)(ABS((float)auVar52._0_8_) < fVar67));
      auVar31._8_4_ = iVar7;
      auVar31._12_4_ = iVar20;
      auVar22._8_4_ = iVar7;
      auVar22._0_8_ = auVar31._0_8_;
      auVar22._12_4_ = iVar20;
      auVar52 = blendvps(auVar52,_DAT_01f80d30,auVar22);
      auVar64 = maxps(auVar64,ZEXT816(0));
      iVar7 = (int)DAT_01f7a9f0;
      iVar20 = DAT_01f7a9f0._4_4_;
      iVar88 = DAT_01f7a9f0._8_4_;
      iVar89 = DAT_01f7a9f0._12_4_;
      auVar23._8_4_ = auVar75._8_4_;
      auVar23._0_8_ = auVar75._0_8_;
      auVar23._12_4_ = auVar75._12_4_;
      aVar90.v = (__m128)blendvps(_DAT_01f7a9f0,auVar64,auVar23);
      local_1748 = auVar24 ^ auVar75;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = (size_t)pvVar16;
      stack_near[1].field_0 = aVar90;
      if (pvVar16 != (vint<4> *)&DAT_fffffffffffffff8) {
        auVar24 = rcpps(auVar23,auVar41);
        local_1708 = auVar24._0_4_;
        auVar42._0_4_ = auVar41._0_4_ * local_1708;
        fStack_1704 = auVar24._4_4_;
        auVar42._4_4_ = auVar41._4_4_ * fStack_1704;
        fStack_1700 = auVar24._8_4_;
        auVar42._8_4_ = auVar41._8_4_ * fStack_1700;
        fStack_16fc = auVar24._12_4_;
        auVar42._12_4_ = auVar41._12_4_ * fStack_16fc;
        auVar24 = rcpps(auVar31,auVar47);
        local_1718 = auVar24._0_4_;
        fStack_1714 = auVar24._4_4_;
        fStack_1710 = auVar24._8_4_;
        fStack_170c = auVar24._12_4_;
        auVar24 = rcpps(auVar42,auVar52);
        local_16f8 = auVar24._0_4_;
        fStack_16f4 = auVar24._4_4_;
        fStack_16f0 = auVar24._8_4_;
        fStack_16ec = auVar24._12_4_;
        local_1718 = (1.0 - auVar47._0_4_ * local_1718) * local_1718 + local_1718;
        fStack_1714 = (1.0 - auVar47._4_4_ * fStack_1714) * fStack_1714 + fStack_1714;
        fStack_1710 = (1.0 - auVar47._8_4_ * fStack_1710) * fStack_1710 + fStack_1710;
        fStack_170c = (1.0 - auVar47._12_4_ * fStack_170c) * fStack_170c + fStack_170c;
        local_1708 = (1.0 - auVar42._0_4_) * local_1708 + local_1708;
        fStack_1704 = (1.0 - auVar42._4_4_) * fStack_1704 + fStack_1704;
        fStack_1700 = (1.0 - auVar42._8_4_) * fStack_1700 + fStack_1700;
        fStack_16fc = (1.0 - auVar42._12_4_) * fStack_16fc + fStack_16fc;
        local_16f8 = (1.0 - auVar52._0_4_ * local_16f8) * local_16f8 + local_16f8;
        fStack_16f4 = (1.0 - auVar52._4_4_ * fStack_16f4) * fStack_16f4 + fStack_16f4;
        fStack_16f0 = (1.0 - auVar52._8_4_ * fStack_16f0) * fStack_16f0 + fStack_16f0;
        fStack_16ec = (1.0 - auVar52._12_4_ * fStack_16ec) * fStack_16ec + fStack_16ec;
        pNVar17 = stack_node + 1;
        puVar9 = mm_lookupmask_ps;
        _local_1738 = mm_lookupmask_ps._0_8_;
        _uStack_1730 = mm_lookupmask_ps._8_8_;
        auVar24 = maxps(auVar34,ZEXT816(0));
        auVar34._8_4_ = auVar75._8_4_;
        auVar34._0_8_ = auVar75._0_8_;
        auVar34._12_4_ = auVar75._12_4_;
        bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                       blendvps(_DAT_01f7aa00,auVar24,auVar34);
        paVar14 = &stack_near[2].field_0;
        local_1798 = aVar90;
        local_1788 = fVar84;
        fStack_1784 = fVar85;
        fStack_1780 = fVar86;
        fStack_177c = fVar87;
        local_1778 = fVar80;
        fStack_1774 = fVar81;
        fStack_1770 = fVar82;
        fStack_176c = fVar83;
        local_1768 = fVar76;
        fStack_1764 = fVar77;
        fStack_1760 = fVar78;
        fStack_175c = fVar79;
        local_1758 = auVar75;
LAB_002410b2:
        aVar32 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar14[-1].v;
        paVar14 = paVar14 + -1;
        auVar25._4_4_ = -(uint)(aVar32.v[1] < (float)bi_8.field_0.i[1]);
        auVar25._0_4_ = -(uint)(aVar32.v[0] < (float)bi_8.field_0.i[0]);
        auVar25._8_4_ = -(uint)(aVar32.v[2] < (float)bi_8.field_0.i[2]);
        auVar25._12_4_ = -(uint)(aVar32._12_4_ < (float)bi_8.field_0.i[3]);
        uVar8 = movmskps((int)puVar9,auVar25);
        puVar9 = (undefined1 *)(ulong)uVar8;
        pvVar10 = (vint<4> *)(ulong)uVar8;
        if (uVar8 != 0) {
          do {
            if (((ulong)pvVar16 & 8) != 0) {
              if (pvVar16 == (vint<4> *)&DAT_fffffffffffffff8) goto LAB_002413f1;
              auVar27._4_4_ = -(uint)(aVar32.v[1] < (float)bi_8.field_0.i[1]);
              auVar27._0_4_ = -(uint)(aVar32.v[0] < (float)bi_8.field_0.i[0]);
              auVar27._8_4_ = -(uint)(aVar32.v[2] < (float)bi_8.field_0.i[2]);
              auVar27._12_4_ = -(uint)(aVar32.v[3] < (float)bi_8.field_0.i[3]);
              uVar8 = movmskps((int)pvVar10,auVar27);
              puVar9 = (undefined1 *)(ulong)uVar8;
              if (uVar8 != 0) {
                uVar11 = (ulong)((uint)pvVar16 & 0xf) - 8;
                uVar12 = uVar11;
                auVar34 = local_1748;
                if (uVar11 == 0) goto LAB_002413c9;
                local_1728 = local_1748 ^ _DAT_01f7ae20;
                uVar18 = 1;
                goto LAB_00241292;
              }
              break;
            }
            lVar15 = 0;
            aVar32.i[1] = iVar20;
            aVar32.i[0] = iVar7;
            aVar32.i[2] = iVar88;
            aVar32.i[3] = iVar89;
            valid_i = (vint<4> *)0x8;
            do {
              pvVar10 = *(vint<4> **)(((ulong)pvVar16 & 0xfffffffffffffff0) + lVar15 * 8);
              if (pvVar10 == (vint<4> *)0x8) break;
              fVar67 = *(float *)((long)&pvVar16[2].field_0 + lVar15 * 4);
              fVar69 = *(float *)((long)&pvVar16[3].field_0 + lVar15 * 4);
              fVar71 = *(float *)((long)&pvVar16[4].field_0 + lVar15 * 4);
              fVar73 = *(float *)((long)&pvVar16[5].field_0 + lVar15 * 4);
              fVar40 = (fVar67 - fVar76) * local_1708;
              fVar43 = (fVar67 - fVar77) * fStack_1704;
              fVar44 = (fVar67 - fVar78) * fStack_1700;
              fVar45 = (fVar67 - fVar79) * fStack_16fc;
              fVar46 = (fVar71 - fVar80) * local_1718;
              fVar48 = (fVar71 - fVar81) * fStack_1714;
              fVar49 = (fVar71 - fVar82) * fStack_1710;
              fVar50 = (fVar71 - fVar83) * fStack_170c;
              fVar67 = *(float *)((long)&pvVar16[6].field_0 + lVar15 * 4);
              fVar51 = (fVar67 - fVar84) * local_16f8;
              fVar53 = (fVar67 - fVar85) * fStack_16f4;
              fVar54 = (fVar67 - fVar86) * fStack_16f0;
              fVar55 = (fVar67 - fVar87) * fStack_16ec;
              fVar71 = (fVar69 - fVar76) * local_1708;
              fVar29 = (fVar69 - fVar77) * fStack_1704;
              fVar30 = (fVar69 - fVar78) * fStack_1700;
              fVar69 = (fVar69 - fVar79) * fStack_16fc;
              fVar35 = (fVar73 - fVar80) * local_1718;
              fVar38 = (fVar73 - fVar81) * fStack_1714;
              fVar39 = (fVar73 - fVar82) * fStack_1710;
              fVar73 = (fVar73 - fVar83) * fStack_170c;
              fVar67 = *(float *)((long)&pvVar16[7].field_0 + lVar15 * 4);
              fVar63 = (fVar67 - fVar84) * local_16f8;
              fVar65 = (fVar67 - fVar85) * fStack_16f4;
              fVar66 = (fVar67 - fVar86) * fStack_16f0;
              fVar67 = (fVar67 - fVar87) * fStack_16ec;
              uVar8 = (uint)((int)fVar71 < (int)fVar40) * (int)fVar71 |
                      (uint)((int)fVar71 >= (int)fVar40) * (int)fVar40;
              uVar57 = (uint)((int)fVar29 < (int)fVar43) * (int)fVar29 |
                       (uint)((int)fVar29 >= (int)fVar43) * (int)fVar43;
              uVar59 = (uint)((int)fVar30 < (int)fVar44) * (int)fVar30 |
                       (uint)((int)fVar30 >= (int)fVar44) * (int)fVar44;
              uVar61 = (uint)((int)fVar69 < (int)fVar45) * (int)fVar69 |
                       (uint)((int)fVar69 >= (int)fVar45) * (int)fVar45;
              uVar68 = (uint)((int)fVar35 < (int)fVar46) * (int)fVar35 |
                       (uint)((int)fVar35 >= (int)fVar46) * (int)fVar46;
              uVar70 = (uint)((int)fVar38 < (int)fVar48) * (int)fVar38 |
                       (uint)((int)fVar38 >= (int)fVar48) * (int)fVar48;
              uVar72 = (uint)((int)fVar39 < (int)fVar49) * (int)fVar39 |
                       (uint)((int)fVar39 >= (int)fVar49) * (int)fVar49;
              uVar74 = (uint)((int)fVar73 < (int)fVar50) * (int)fVar73 |
                       (uint)((int)fVar73 >= (int)fVar50) * (int)fVar50;
              uVar68 = ((int)uVar68 < (int)uVar8) * uVar8 | ((int)uVar68 >= (int)uVar8) * uVar68;
              uVar70 = ((int)uVar70 < (int)uVar57) * uVar57 | ((int)uVar70 >= (int)uVar57) * uVar70;
              uVar72 = ((int)uVar72 < (int)uVar59) * uVar59 | ((int)uVar72 >= (int)uVar59) * uVar72;
              uVar74 = ((int)uVar74 < (int)uVar61) * uVar61 | ((int)uVar74 >= (int)uVar61) * uVar74;
              uVar8 = (uint)((int)fVar63 < (int)fVar51) * (int)fVar63 |
                      (uint)((int)fVar63 >= (int)fVar51) * (int)fVar51;
              uVar57 = (uint)((int)fVar65 < (int)fVar53) * (int)fVar65 |
                       (uint)((int)fVar65 >= (int)fVar53) * (int)fVar53;
              uVar59 = (uint)((int)fVar66 < (int)fVar54) * (int)fVar66 |
                       (uint)((int)fVar66 >= (int)fVar54) * (int)fVar54;
              uVar61 = (uint)((int)fVar67 < (int)fVar55) * (int)fVar67 |
                       (uint)((int)fVar67 >= (int)fVar55) * (int)fVar55;
              uVar56 = ((int)uVar8 < (int)uVar68) * uVar68 | ((int)uVar8 >= (int)uVar68) * uVar8;
              uVar58 = ((int)uVar57 < (int)uVar70) * uVar70 | ((int)uVar57 >= (int)uVar70) * uVar57;
              uVar60 = ((int)uVar59 < (int)uVar72) * uVar72 | ((int)uVar59 >= (int)uVar72) * uVar59;
              uVar62 = ((int)uVar61 < (int)uVar74) * uVar74 | ((int)uVar61 >= (int)uVar74) * uVar61;
              uVar8 = (uint)((int)fVar71 < (int)fVar40) * (int)fVar40 |
                      (uint)((int)fVar71 >= (int)fVar40) * (int)fVar71;
              uVar57 = (uint)((int)fVar29 < (int)fVar43) * (int)fVar43 |
                       (uint)((int)fVar29 >= (int)fVar43) * (int)fVar29;
              uVar59 = (uint)((int)fVar30 < (int)fVar44) * (int)fVar44 |
                       (uint)((int)fVar30 >= (int)fVar44) * (int)fVar30;
              uVar61 = (uint)((int)fVar69 < (int)fVar45) * (int)fVar45 |
                       (uint)((int)fVar69 >= (int)fVar45) * (int)fVar69;
              uVar68 = (uint)((int)fVar35 < (int)fVar46) * (int)fVar46 |
                       (uint)((int)fVar35 >= (int)fVar46) * (int)fVar35;
              uVar70 = (uint)((int)fVar38 < (int)fVar48) * (int)fVar48 |
                       (uint)((int)fVar38 >= (int)fVar48) * (int)fVar38;
              uVar72 = (uint)((int)fVar39 < (int)fVar49) * (int)fVar49 |
                       (uint)((int)fVar39 >= (int)fVar49) * (int)fVar39;
              uVar74 = (uint)((int)fVar73 < (int)fVar50) * (int)fVar50 |
                       (uint)((int)fVar73 >= (int)fVar50) * (int)fVar73;
              uVar8 = ((int)uVar8 < (int)uVar68) * uVar8 | ((int)uVar8 >= (int)uVar68) * uVar68;
              uVar57 = ((int)uVar57 < (int)uVar70) * uVar57 | ((int)uVar57 >= (int)uVar70) * uVar70;
              uVar59 = ((int)uVar59 < (int)uVar72) * uVar59 | ((int)uVar59 >= (int)uVar72) * uVar72;
              uVar61 = ((int)uVar61 < (int)uVar74) * uVar61 | ((int)uVar61 >= (int)uVar74) * uVar74;
              uVar68 = (uint)((int)fVar63 < (int)fVar51) * (int)fVar51 |
                       (uint)((int)fVar63 >= (int)fVar51) * (int)fVar63;
              uVar70 = (uint)((int)fVar65 < (int)fVar53) * (int)fVar53 |
                       (uint)((int)fVar65 >= (int)fVar53) * (int)fVar65;
              uVar72 = (uint)((int)fVar66 < (int)fVar54) * (int)fVar54 |
                       (uint)((int)fVar66 >= (int)fVar54) * (int)fVar66;
              uVar74 = (uint)((int)fVar67 < (int)fVar55) * (int)fVar55 |
                       (uint)((int)fVar67 >= (int)fVar55) * (int)fVar67;
              iVar1 = aVar90.i[0];
              iVar2 = aVar90.i[1];
              iVar3 = aVar90.i[2];
              iVar4 = aVar90.i[3];
              uVar68 = (uint)(bi_8.field_0.i[0] < (int)uVar68) * bi_8.field_0.i[0] |
                       (bi_8.field_0.i[0] >= (int)uVar68) * uVar68;
              uVar70 = (uint)(bi_8.field_0.i[1] < (int)uVar70) * bi_8.field_0.i[1] |
                       (bi_8.field_0.i[1] >= (int)uVar70) * uVar70;
              uVar72 = (uint)(bi_8.field_0.i[2] < (int)uVar72) * bi_8.field_0.i[2] |
                       (bi_8.field_0.i[2] >= (int)uVar72) * uVar72;
              uVar74 = (uint)(bi_8.field_0.i[3] < (int)uVar74) * bi_8.field_0.i[3] |
                       (bi_8.field_0.i[3] >= (int)uVar74) * uVar74;
              auVar26._4_4_ =
                   -(uint)((float)((uint)((int)uVar58 < iVar2) * iVar2 |
                                  ((int)uVar58 >= iVar2) * uVar58) <=
                          (float)(((int)uVar57 < (int)uVar70) * uVar57 |
                                 ((int)uVar57 >= (int)uVar70) * uVar70));
              auVar26._0_4_ =
                   -(uint)((float)((uint)((int)uVar56 < iVar1) * iVar1 |
                                  ((int)uVar56 >= iVar1) * uVar56) <=
                          (float)(((int)uVar8 < (int)uVar68) * uVar8 |
                                 ((int)uVar8 >= (int)uVar68) * uVar68));
              auVar26._8_4_ =
                   -(uint)((float)((uint)((int)uVar60 < iVar3) * iVar3 |
                                  ((int)uVar60 >= iVar3) * uVar60) <=
                          (float)(((int)uVar59 < (int)uVar72) * uVar59 |
                                 ((int)uVar59 >= (int)uVar72) * uVar72));
              auVar26._12_4_ =
                   -(uint)((float)((uint)((int)uVar62 < iVar4) * iVar4 |
                                  ((int)uVar62 >= iVar4) * uVar62) <=
                          (float)(((int)uVar61 < (int)uVar74) * uVar61 |
                                 ((int)uVar61 >= (int)uVar74) * uVar74));
              uVar8 = movmskps((int)this,auVar26);
              this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
                      *)(ulong)uVar8;
              pvVar6 = valid_i;
              aVar37 = aVar32;
              if ((uVar8 != 0) &&
                 (auVar36._4_4_ = iVar20, auVar36._0_4_ = iVar7, auVar36._8_4_ = iVar88,
                 auVar36._12_4_ = iVar89, auVar5._4_4_ = uVar58, auVar5._0_4_ = uVar56,
                 auVar5._8_4_ = uVar60, auVar5._12_4_ = uVar62,
                 aVar37 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                          blendvps(auVar36,auVar5,auVar26), pvVar6 = pvVar10,
                 valid_i != (vint<4> *)0x8)) {
                pNVar17->ptr = (size_t)valid_i;
                pNVar17 = pNVar17 + 1;
                *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar14->v = aVar32;
                paVar14 = paVar14 + 1;
              }
              aVar32 = aVar37;
              valid_i = pvVar6;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 4);
            puVar9 = (undefined1 *)pvVar16;
            pvVar10 = pvVar16;
            pvVar16 = valid_i;
          } while (valid_i != (vint<4> *)0x8);
        }
        goto LAB_00241226;
      }
LAB_002413f1:
      auVar34 = blendvps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,_DAT_01f7aa00,
                         auVar75 & local_1748);
      *(undefined1 (*) [16])&(This->intersector4_nofilter).name = auVar34;
    }
  }
  return;
  while( true ) {
    uVar12 = uVar18 + 1;
    local_1728._4_4_ = auVar28._4_4_;
    local_1728._0_4_ = auVar28._0_4_;
    local_1728._8_4_ = auVar28._8_4_;
    local_1728._12_4_ = auVar28._12_4_;
    bVar19 = uVar11 <= uVar18;
    uVar18 = uVar12;
    if (bVar19) break;
LAB_00241292:
    local_17b4 = *(uint *)((((ulong)pvVar16 & 0xfffffffffffffff0) - 8) + uVar18 * 8);
    local_17b0 = *(long *)(*(long *)(*(long *)ray + 0x1e8) + (ulong)local_17b4 * 8);
    uVar8 = *(uint *)(local_17b0 + 0x34);
    auVar33._0_4_ = -(uint)((uVar8 & *(uint *)&(This->intersector8).occluded) == 0);
    auVar33._4_4_ = -(uint)((uVar8 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
    auVar33._8_4_ = -(uint)((uVar8 & *(uint *)&(This->intersector8).name) == 0);
    auVar33._12_4_ = -(uint)((uVar8 & *(uint *)((long)&(This->intersector8).name + 4)) == 0);
    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)(~auVar33 & local_1728);
    uVar68 = movmskps((int)valid_i,(undefined1  [16])mask.field_0);
    valid_i = (vint<4> *)(ulong)uVar68;
    uVar8 = local_1738;
    uVar57 = uStack_1734;
    uVar59 = uStack_1730;
    uVar61 = uStack_172c;
    if (uVar68 != 0) {
      local_17d0 = *(undefined4 *)((((ulong)pvVar16 & 0xfffffffffffffff0) - 4) + uVar18 * 8);
      local_17e0 = &mask;
      local_17d8 = *(undefined8 *)(local_17b0 + 0x18);
      valid_i = *(vint<4> **)(ray + 8);
      local_17b8 = 4;
      local_17a8 = 0;
      local_17a0 = *(long *)(ray + 0x10);
      pcVar13 = *(code **)(local_17a0 + 0x18);
      if (pcVar13 == (code *)0x0) {
        pcVar13 = *(code **)(local_17b0 + 0x68);
      }
      this = (BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
              *)&local_17e0;
      local_17c8 = valid_i;
      local_17c0 = This;
      local_17b0 = (*pcVar13)();
      uVar8 = -(uint)(*(float *)&(This->intersector4_nofilter).name < 0.0);
      uVar57 = -(uint)(*(float *)((long)&(This->intersector4_nofilter).name + 4) < 0.0);
      uVar59 = -(uint)(*(float *)&(This->intersector8).intersect < 0.0);
      uVar61 = -(uint)(*(float *)((long)&(This->intersector8).intersect + 4) < 0.0);
      iVar7 = 0x7f800000;
      iVar20 = 0x7f800000;
      iVar88 = 0x7f800000;
      iVar89 = 0x7f800000;
      auVar34 = local_1748;
      auVar75 = local_1758;
      fVar76 = local_1768;
      fVar77 = fStack_1764;
      fVar78 = fStack_1760;
      fVar79 = fStack_175c;
      fVar80 = local_1778;
      fVar81 = fStack_1774;
      fVar82 = fStack_1770;
      fVar83 = fStack_176c;
      fVar84 = local_1788;
      fVar85 = fStack_1784;
      fVar86 = fStack_1780;
      fVar87 = fStack_177c;
      aVar90 = local_1798;
    }
    auVar28._0_4_ = ~uVar8 & local_1728._0_4_;
    auVar28._4_4_ = ~uVar57 & local_1728._4_4_;
    auVar28._8_4_ = ~uVar59 & local_1728._8_4_;
    auVar28._12_4_ = ~uVar61 & local_1728._12_4_;
    uVar8 = movmskps((int)local_17b0,auVar28);
    uVar12 = (ulong)uVar8;
    if (uVar8 == 0) break;
  }
  uVar11 = CONCAT44(auVar28._4_4_,auVar28._0_4_);
  local_1748._0_8_ = uVar11 ^ 0xffffffffffffffff;
  local_1748._8_4_ = auVar28._8_4_ ^ 0xffffffff;
  local_1748._12_4_ = auVar28._12_4_ ^ 0xffffffff;
LAB_002413c9:
  local_1748 = auVar34 | local_1748;
  uVar8 = movmskps((int)uVar12,local_1748);
  puVar9 = (undefined1 *)(ulong)uVar8;
  if (uVar8 == 0xf) goto LAB_002413f1;
  bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                 blendvps((undefined1  [16])bi_8.field_0,_DAT_01f7aa00,local_1748);
LAB_00241226:
  pvVar16 = (vint<4> *)pNVar17[-1].ptr;
  pNVar17 = pNVar17 + -1;
  if (pvVar16 == (vint<4> *)0xfffffffffffffff8) goto LAB_002413f1;
  goto LAB_002410b2;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }